

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

void __thiscall
avro::
NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::setLeafToSymbolic(NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                    *this,int index,NodePtr *node)

{
  bool bVar1;
  shared_ptr<avro::Node> *this_00;
  type pNVar2;
  undefined8 uVar3;
  NodeSymbolic *this_01;
  shared_ptr<avro::Node> *in_RDX;
  NodeSymbolic *ptr;
  NodePtr symbol;
  NodePtr *replaceNode;
  Name *in_stack_ffffffffffffff58;
  Name *name;
  NodeSymbolic *in_stack_ffffffffffffff60;
  NodeSymbolic *in_stack_ffffffffffffff78;
  shared_ptr<avro::Node> *in_stack_ffffffffffffff80;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  this_00 = concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>::get
                      ((MultiAttribute<boost::shared_ptr<avro::Node>_> *)in_stack_ffffffffffffff60,
                       (size_t)in_stack_ffffffffffffff58);
  pNVar2 = boost::shared_ptr<avro::Node>::operator->(this_00);
  (*pNVar2->_vptr_Node[3])();
  pNVar2 = boost::shared_ptr<avro::Node>::operator->(in_RDX);
  (*pNVar2->_vptr_Node[3])();
  bVar1 = Name::operator!=((Name *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (!bVar1) {
    operator_new(0x68);
    NodeSymbolic::NodeSymbolic(in_stack_ffffffffffffff60);
    name = (Name *)&stack0xffffffffffffff98;
    boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeSymbolic>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    this_01 = (NodeSymbolic *)boost::shared_ptr<avro::Node>::get((shared_ptr<avro::Node> *)name);
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(in_RDX);
    (*pNVar2->_vptr_Node[3])();
    Node::setName((Node *)this_01,name);
    NodeSymbolic::setNode(this_01,(NodePtr *)name);
    boost::shared_ptr<avro::Node>::swap
              ((shared_ptr<avro::Node> *)this_01,(shared_ptr<avro::Node> *)name);
    boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x1c2b04);
    return;
  }
  uVar3 = __cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Exception::Exception((Exception *)in_stack_ffffffffffffff60,&in_stack_ffffffffffffff58->ns_);
  __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void 
NodeImpl<A,B,C,D>::setLeafToSymbolic(int index, const NodePtr &node)
{
    if(!B::hasAttribute) {
        throw Exception("Cannot change leaf node for nonexistent leaf");
    } 

    NodePtr &replaceNode = const_cast<NodePtr &>(leafAttributes_.get(index));
    if(replaceNode->name() != node->name()) {
        throw Exception("Symbolic name does not match the name of the schema it references");
    }

    NodePtr symbol(new NodeSymbolic);
    NodeSymbolic *ptr = static_cast<NodeSymbolic *> (symbol.get());

    ptr->setName(node->name());
    ptr->setNode(node);
    replaceNode.swap(symbol);
}